

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

double SubsetCountMintermAux(DdNode *node,double max,st__table *table)

{
  int iVar1;
  NodeData_t *value;
  double dVar2;
  int local_74;
  int i;
  NodeData_t *newEntry;
  NodeData_t *dummy;
  double min2;
  double min1;
  double *pmin;
  double min;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  st__table *table_local;
  double max_local;
  DdNode *node_local;
  
  if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
    node_local = (DdNode *)max;
    if (node == zero) {
      node_local = (DdNode *)0x0;
    }
  }
  else {
    N = (DdNode *)table;
    table_local = (st__table *)max;
    max_local = (double)node;
    iVar1 = st__lookup(table,(char *)node,(char **)&newEntry);
    if (iVar1 == 0) {
      Nv = (DdNode *)((ulong)max_local & 0xfffffffffffffffe);
      Nnv = (DdNode *)((ulong)(Nv->type).kids.T ^ (long)(int)(SUB84(max_local,0) & 1));
      min = (double)((ulong)(Nv->type).kids.E ^ (long)(int)(SUB84(max_local,0) & 1));
      dVar2 = SubsetCountMintermAux(Nnv,(double)table_local,(st__table *)N);
      min2 = dVar2 / 2.0;
      if (memOut == 0) {
        dVar2 = SubsetCountMintermAux((DdNode *)min,(double)table_local,(st__table *)N);
        dummy = (NodeData_t *)(dVar2 / 2.0);
        if (memOut == 0) {
          pmin = (double *)(min2 + (double)dummy);
          if (pageIndex == pageSize) {
            ResizeCountMintermPages();
          }
          if (memOut == 0) {
            min1 = (double)(currentMintermPage + pageIndex);
            pageIndex = pageIndex + 1;
            *(double **)min1 = pmin;
            if (nodeDataPageIndex == nodeDataPageSize) {
              ResizeNodeDataPages();
            }
            if (memOut == 0) {
              value = currentNodeDataPage + nodeDataPageIndex;
              nodeDataPageIndex = nodeDataPageIndex + 1;
              value->mintermPointer = (double *)min1;
              value->nodesPointer = (int *)0x0;
              iVar1 = st__insert((st__table *)N,(char *)max_local,(char *)value);
              if (iVar1 == -10000) {
                memOut = 1;
                for (local_74 = 0; local_74 <= page; local_74 = local_74 + 1) {
                  if (mintermPages[local_74] != (double *)0x0) {
                    free(mintermPages[local_74]);
                    mintermPages[local_74] = (double *)0x0;
                  }
                }
                if (mintermPages != (double **)0x0) {
                  free(mintermPages);
                  mintermPages = (double **)0x0;
                }
                for (local_74 = 0; local_74 <= nodeDataPage; local_74 = local_74 + 1) {
                  if (nodeDataPages[local_74] != (NodeData_t *)0x0) {
                    free(nodeDataPages[local_74]);
                    nodeDataPages[local_74] = (NodeData_t *)0x0;
                  }
                }
                if (nodeDataPages != (NodeData_t **)0x0) {
                  free(nodeDataPages);
                  nodeDataPages = (NodeData_t **)0x0;
                }
                st__free_table((st__table *)N);
                node_local = (DdNode *)0x0;
              }
              else {
                node_local = (DdNode *)pmin;
              }
            }
            else {
              for (local_74 = 0; local_74 <= page; local_74 = local_74 + 1) {
                if (mintermPages[local_74] != (double *)0x0) {
                  free(mintermPages[local_74]);
                  mintermPages[local_74] = (double *)0x0;
                }
              }
              if (mintermPages != (double **)0x0) {
                free(mintermPages);
                mintermPages = (double **)0x0;
              }
              st__free_table((st__table *)N);
              node_local = (DdNode *)0x0;
            }
          }
          else {
            for (local_74 = 0; local_74 <= nodeDataPage; local_74 = local_74 + 1) {
              if (nodeDataPages[local_74] != (NodeData_t *)0x0) {
                free(nodeDataPages[local_74]);
                nodeDataPages[local_74] = (NodeData_t *)0x0;
              }
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table((st__table *)N);
            node_local = (DdNode *)0x0;
          }
        }
        else {
          node_local = (DdNode *)0x0;
        }
      }
      else {
        node_local = (DdNode *)0x0;
      }
    }
    else {
      node_local = (DdNode *)*newEntry->mintermPointer;
    }
  }
  return (double)node_local;
}

Assistant:

static double
SubsetCountMintermAux(
  DdNode * node /* function to analyze */,
  double  max /* number of minterms of constant 1 */,
  st__table * table /* visitedTable table */)
{

    DdNode      *N,*Nv,*Nnv; /* nodes to store cofactors  */
    double      min,*pmin; /* minterm count */
    double      min1, min2; /* minterm count */
    NodeData_t *dummy;
    NodeData_t *newEntry;
    int i;

#ifdef DEBUG
    num_calls++;
#endif

    /* Constant case */
    if (Cudd_IsConstant(node)) {
        if (node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    } else {

        /* check if entry for this node exists */
        if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
            min = *(dummy->mintermPointer);
            return(min);
        }

        /* Make the node regular to extract cofactors */
        N = Cudd_Regular(node);

        /* store the cofactors */
        Nv = Cudd_T(N);
        Nnv = Cudd_E(N);

        Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
        Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

        min1 =  SubsetCountMintermAux(Nv, max,table)/2.0;
        if (memOut) return(0.0);
        min2 =  SubsetCountMintermAux(Nnv,max,table)/2.0;
        if (memOut) return(0.0);
        min = (min1+min2);

        /* if page index is at the bottom, then create a new page */
        if (pageIndex == pageSize) ResizeCountMintermPages();
        if (memOut) {
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }

        /* point to the correct location in the page */
        pmin = currentMintermPage+pageIndex;
        pageIndex++;

        /* store the minterm count of this node in the page */
        *pmin = min;

        /* Note I allocate the struct here. Freeing taken care of later */
        if (nodeDataPageIndex == nodeDataPageSize) ResizeNodeDataPages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            st__free_table(table);
            return(0.0);
        }

        newEntry = currentNodeDataPage + nodeDataPageIndex;
        nodeDataPageIndex++;

        /* points to the correct location in the page */
        newEntry->mintermPointer = pmin;
        /* initialize this field of the Node Quality structure */
        newEntry->nodesPointer = NULL;

        /* insert entry for the node in the table */
        if ( st__insert(table,(char *)node, (char *)newEntry) == st__OUT_OF_MEM) {
            memOut = 1;
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }
        return(min);
    }

}